

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::append_entries_in_bg(raft_server *this)

{
  element_type *peVar1;
  int iVar2;
  pthread_t __target_thread;
  string thread_name;
  string local_58;
  char *local_38 [2];
  char local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"nuraft_append","");
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,local_38[0]);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_58,"bg append_entries thread initiated");
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"append_entries_in_bg",0x68,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
  }
  do {
    EventAwaiter::wait_us(this->bg_append_ea_,0);
    LOCK();
    (this->bg_append_ea_->status)._M_i = idle;
    UNLOCK();
    if (((this->stopping_)._M_base._M_i & 1U) != 0) break;
    append_entries_in_bg_exec(this);
  } while (((this->stopping_)._M_base._M_i & 1U) == 0);
  LOCK();
  (this->append_bg_stopped_)._M_base._M_i = true;
  UNLOCK();
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_58,"bg append_entries thread terminated");
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"append_entries_in_bg",0x71,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void raft_server::append_entries_in_bg() {
    std::string thread_name = "nuraft_append";
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    p_in("bg append_entries thread initiated");
    do {
        bg_append_ea_->wait();
        bg_append_ea_->reset();
        if (stopping_) break;

        append_entries_in_bg_exec();
    } while (!stopping_);
    append_bg_stopped_ = true;
    p_in("bg append_entries thread terminated");
}